

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

void absl::anon_unknown_0::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  char *__s;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  int width;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_type __n;
  long v;
  double dVar8;
  char local_3a [2];
  undefined8 local_38;
  
  width = 0xf;
  if (unit.prec < 0xf) {
    width = unit.prec;
  }
  local_38 = 0.0;
  dVar8 = modf(n,(double *)&local_38);
  dVar8 = dVar8 * unit.pow10;
  if (0.0 <= dVar8) {
    dVar8 = floor(dVar8 + 0.5);
  }
  else {
    dVar8 = ceil(dVar8 + -0.5);
  }
  v = (long)dVar8;
  if ((long)local_38 != 0 || v != 0) {
    uVar7 = 0xffffffff;
    lVar2 = (long)local_38;
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      local_3a[uVar5 + 1] = (char)lVar2 + (char)(lVar2 / 10) * -10 + '0';
      uVar3 = lVar2 + 9;
      uVar6 = uVar5 - 1;
      uVar7 = uVar7 - 1;
      lVar2 = lVar2 / 10;
    } while (0x12 < uVar3);
    if ((int)uVar6 + 1 < 2) {
      pcVar4 = local_3a + uVar5 + 1;
    }
    else {
      pcVar4 = local_3a + (uVar6 - uVar7) + 1;
      memset(pcVar4,0x30,uVar6 & 0xffffffff);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,pcVar4,(long)&local_38 - (long)pcVar4);
    if (v != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (out,'.');
      __s = Format64((char *)&local_38,width,v);
      __n = (long)&local_38 + (1 - (long)__s);
      pcVar4 = local_3a + 1;
      do {
        __n = __n - 1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + -1;
      } while (cVar1 == '0');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (out,__s,__n);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,unit.abbr._M_str,unit.abbr._M_len);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = Round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, ep - bp);
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, ep - bp);
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}